

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen_interactive.cpp
# Opt level: O1

void __thiscall ftxui::ScreenInteractive::Draw(ScreenInteractive *this,Component *component)

{
  int iVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  Dimensions DVar5;
  ostream *poVar6;
  long *plVar7;
  undefined8 *puVar8;
  uint uVar9;
  uint uVar10;
  long *plVar11;
  pointer pPVar12;
  size_type *psVar13;
  pointer pvVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  uint __uval;
  uint uVar19;
  int iVar20;
  uint uVar21;
  string __str_1;
  string __str;
  Element document;
  string local_b8;
  undefined1 local_98 [24];
  long lStack_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  undefined1 local_68 [23];
  allocator_type local_51;
  Element local_50;
  string *local_40;
  string *local_38;
  
  (*((component->super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
    _vptr_ComponentBase[2])(&local_50);
  switch(this->dimension_) {
  case FitComponent:
    DVar5 = Terminal::Size();
    (*(local_50.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Node[2])
              ();
    iVar20 = ((local_50.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             requirement_).min_x;
    if (DVar5.dimx <= iVar20) {
      iVar20 = DVar5.dimx;
    }
    iVar1 = ((local_50.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            requirement_).min_y;
    iVar16 = DVar5.dimy;
    if (iVar1 < DVar5.dimy) {
      iVar16 = iVar1;
    }
    break;
  case Fixed:
    iVar20 = (this->super_Screen).dimx_;
    iVar16 = (this->super_Screen).dimy_;
    break;
  case Fullscreen:
    DVar5 = Terminal::Size();
    iVar20 = DVar5.dimx;
    DVar5 = Terminal::Size();
    iVar16 = DVar5.dimy;
    break;
  case TerminalOutput:
    (*(local_50.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Node[2])
              ();
    DVar5 = Terminal::Size();
    iVar20 = DVar5.dimx;
    iVar16 = ((local_50.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             requirement_).min_y;
    break;
  default:
    iVar20 = 0;
    iVar16 = 0;
  }
  bVar3 = (this->super_Screen).dimy_ != iVar16;
  bVar4 = (this->super_Screen).dimx_ != iVar20;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(this->reset_cursor_position)._M_dataplus._M_p,
                      (this->reset_cursor_position)._M_string_length);
  Screen::ResetPosition_abi_cxx11_(&local_b8,&this->super_Screen,bVar3 || bVar4);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,local_b8._M_dataplus._M_p,local_b8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,(ulong)(local_b8.field_2._M_allocated_capacity + 1));
  }
  if (bVar3 || bVar4) {
    (this->super_Screen).dimx_ = iVar20;
    (this->super_Screen).dimy_ = iVar16;
    std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>::vector
              ((vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_> *)local_98,(long)iVar20,
               &local_51);
    std::
    vector<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>,_std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>_>
    ::vector((vector<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>,_std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>_>
              *)&local_78,(long)iVar16,(value_type *)local_98,(allocator_type *)(local_68 + 0x16));
    local_b8._M_dataplus._M_p =
         (pointer)(this->super_Screen).pixels_.
                  super__Vector_base<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>,_std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_b8._M_string_length =
         (size_type)
         (this->super_Screen).pixels_.
         super__Vector_base<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>,_std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_b8.field_2._M_allocated_capacity =
         (size_type)
         (this->super_Screen).pixels_.
         super__Vector_base<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>,_std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->super_Screen).pixels_.
    super__Vector_base<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>,_std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_78._M_allocated_capacity;
    (this->super_Screen).pixels_.
    super__Vector_base<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>,_std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_78._8_8_;
    (this->super_Screen).pixels_.
    super__Vector_base<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>,_std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_68._0_8_;
    local_78._M_allocated_capacity = 0;
    local_78._8_8_ = (pointer)0x0;
    local_68._0_8_ = (pointer)0x0;
    std::
    vector<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>,_std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>_>
    ::~vector((vector<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>,_std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>_>
               *)&local_b8);
    std::
    vector<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>,_std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>_>
    ::~vector((vector<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>,_std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>_>
               *)&local_78);
    std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>::~vector
              ((vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_> *)local_98);
    iVar20 = (this->super_Screen).dimy_;
    (this->super_Screen).cursor_.x = (this->super_Screen).dimx_ + -1;
    (this->super_Screen).cursor_.y = iVar20 + -1;
  }
  iVar20 = Draw::i + 1;
  if ((this->use_alternative_screen_ == false) && (Draw::i + (iVar20 / 0x14) * -0x14 == -1)) {
    Draw::i = iVar20;
    local_78._M_allocated_capacity = (size_type)(pointer)local_68;
    std::__cxx11::string::_M_construct((ulong)&local_78,'\x01');
    *(undefined1 *)local_78._M_allocated_capacity = 0x36;
    plVar7 = (long *)std::__cxx11::string::replace
                               ((ulong)&local_78,0,(char *)0x0,(anonymous_namespace)::CSI_abi_cxx11_
                               );
    plVar11 = plVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)plVar11) {
      local_b8.field_2._M_allocated_capacity = *plVar11;
      local_b8.field_2._8_8_ = plVar7[3];
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    }
    else {
      local_b8.field_2._M_allocated_capacity = *plVar11;
      local_b8._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_b8._M_string_length = plVar7[1];
    *plVar7 = (long)plVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_b8);
    pPVar12 = (pointer)(plVar7 + 2);
    if ((pointer)*plVar7 == pPVar12) {
      local_98._16_8_ = (pPVar12->character)._M_dataplus._M_p;
      lStack_80 = plVar7[3];
      local_98._0_8_ = (pointer)(local_98 + 0x10);
    }
    else {
      local_98._16_8_ = (pPVar12->character)._M_dataplus._M_p;
      local_98._0_8_ = (pointer)*plVar7;
    }
    local_98._8_8_ = plVar7[1];
    *plVar7 = (long)pPVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,(ulong)(local_b8.field_2._M_allocated_capacity + 1))
      ;
    }
    if ((pointer)local_78._M_allocated_capacity != (pointer)local_68) {
      operator_delete((void *)local_78._M_allocated_capacity,
                      (ulong)((long)&(((_Vector_impl *)&((string *)local_68._0_8_)->_M_dataplus)->
                                     super__Vector_impl_data)._M_start + 1));
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,(char *)local_98._0_8_,local_98._8_8_);
    iVar20 = Draw::i;
    if ((pointer)local_98._0_8_ != (pointer)(local_98 + 0x10)) {
      operator_delete((void *)local_98._0_8_,
                      (ulong)((long)&(((string *)local_98._16_8_)->_M_dataplus)._M_p + 1));
      iVar20 = Draw::i;
    }
  }
  Draw::i = iVar20;
  ftxui::Render(&this->super_Screen,&local_50);
  local_38 = &this->set_cursor_position;
  std::__cxx11::string::_M_replace
            ((ulong)local_38,0,(char *)(this->set_cursor_position)._M_string_length,0x1595e9);
  local_40 = &this->reset_cursor_position;
  std::__cxx11::string::_M_replace
            ((ulong)local_40,0,(char *)(this->reset_cursor_position)._M_string_length,0x1595e9);
  uVar21 = ~(this->super_Screen).cursor_.y + (this->super_Screen).dimy_;
  uVar19 = ~(this->super_Screen).cursor_.x + (this->super_Screen).dimx_;
  if (uVar19 != 0) {
    uVar18 = -uVar19;
    if (0 < (int)uVar19) {
      uVar18 = uVar19;
    }
    uVar17 = 1;
    if (9 < uVar18) {
      uVar15 = (ulong)uVar18;
      uVar10 = 4;
      do {
        uVar17 = uVar10;
        uVar9 = (uint)uVar15;
        if (uVar9 < 100) {
          uVar17 = uVar17 - 2;
          goto LAB_00146356;
        }
        if (uVar9 < 1000) {
          uVar17 = uVar17 - 1;
          goto LAB_00146356;
        }
        if (uVar9 < 10000) goto LAB_00146356;
        uVar15 = uVar15 / 10000;
        uVar10 = uVar17 + 4;
      } while (99999 < uVar9);
      uVar17 = uVar17 + 1;
    }
LAB_00146356:
    cVar2 = (char)((int)uVar19 >> 0x1f);
    local_98._0_8_ = local_98 + 0x10;
    std::__cxx11::string::_M_construct((ulong)local_98,(char)uVar17 - cVar2);
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((long)&(((string *)local_98._0_8_)->_M_dataplus)._M_p +
                       (ulong)(uVar19 >> 0x1f)),uVar17,uVar18);
    plVar7 = (long *)std::__cxx11::string::replace((ulong)local_98,0,(char *)0x0,0x15aa90);
    plVar11 = plVar7 + 2;
    if ((long *)*plVar7 == plVar11) {
      local_68._0_8_ = *plVar11;
      local_68._8_8_ = plVar7[3];
      local_78._M_allocated_capacity = (size_type)local_68;
    }
    else {
      local_68._0_8_ = *plVar11;
      local_78._M_allocated_capacity = (size_type)(long *)*plVar7;
    }
    local_78._8_8_ = plVar7[1];
    *plVar7 = (long)plVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append(local_78._M_local_buf);
    psVar13 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_b8.field_2._M_allocated_capacity = *psVar13;
      local_b8.field_2._8_8_ = plVar7[3];
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    }
    else {
      local_b8.field_2._M_allocated_capacity = *psVar13;
      local_b8._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_b8._M_string_length = plVar7[1];
    *plVar7 = (long)psVar13;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_38,(ulong)local_b8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_78._M_allocated_capacity != local_68) {
      operator_delete((void *)local_78._M_allocated_capacity,
                      (ulong)((long)&(((string *)local_68._0_8_)->_M_dataplus)._M_p + 1));
    }
    if ((pointer)local_98._0_8_ != (pointer)(local_98 + 0x10)) {
      operator_delete((void *)local_98._0_8_,
                      (ulong)((long)&(((string *)local_98._16_8_)->_M_dataplus)._M_p + 1));
    }
    uVar17 = 1;
    if (9 < uVar18) {
      uVar15 = (ulong)uVar18;
      uVar10 = 4;
      do {
        uVar17 = uVar10;
        uVar9 = (uint)uVar15;
        if (uVar9 < 100) {
          uVar17 = uVar17 - 2;
          goto LAB_001464ed;
        }
        if (uVar9 < 1000) {
          uVar17 = uVar17 - 1;
          goto LAB_001464ed;
        }
        if (uVar9 < 10000) goto LAB_001464ed;
        uVar15 = uVar15 / 10000;
        uVar10 = uVar17 + 4;
      } while (99999 < uVar9);
      uVar17 = uVar17 + 1;
    }
LAB_001464ed:
    local_98._0_8_ = local_98 + 0x10;
    std::__cxx11::string::_M_construct((ulong)local_98,(char)uVar17 - cVar2);
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((long)&(((string *)local_98._0_8_)->_M_dataplus)._M_p +
                       (ulong)(uVar19 >> 0x1f)),uVar17,uVar18);
    puVar8 = (undefined8 *)std::__cxx11::string::replace((ulong)local_98,0,(char *)0x0,0x15aa90);
    pvVar14 = (pointer)(puVar8 + 2);
    if ((pointer)*puVar8 == pvVar14) {
      local_68._0_8_ =
           (pvVar14->super__Vector_base<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>)._M_impl.
           super__Vector_impl_data._M_start;
      local_68._8_8_ = puVar8[3];
      local_78._M_allocated_capacity = (size_type)(pointer)local_68;
    }
    else {
      local_68._0_8_ =
           (pvVar14->super__Vector_base<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>)._M_impl.
           super__Vector_impl_data._M_start;
      local_78._M_allocated_capacity = (size_type)(pointer)*puVar8;
    }
    local_78._8_8_ = puVar8[1];
    *puVar8 = pvVar14;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append(local_78._M_local_buf);
    plVar11 = plVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)plVar11) {
      local_b8.field_2._M_allocated_capacity = *plVar11;
      local_b8.field_2._8_8_ = plVar7[3];
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    }
    else {
      local_b8.field_2._M_allocated_capacity = *plVar11;
      local_b8._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_b8._M_string_length = plVar7[1];
    *plVar7 = (long)plVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_40,(ulong)local_b8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,(ulong)(local_b8.field_2._M_allocated_capacity + 1))
      ;
    }
    if ((pointer)local_78._M_allocated_capacity != (pointer)local_68) {
      operator_delete((void *)local_78._M_allocated_capacity,
                      (ulong)((long)&(((_Vector_impl *)&((string *)local_68._0_8_)->_M_dataplus)->
                                     super__Vector_impl_data)._M_start + 1));
    }
    if ((pointer)local_98._0_8_ != (pointer)(local_98 + 0x10)) {
      operator_delete((void *)local_98._0_8_,
                      (ulong)((long)&(((string *)local_98._16_8_)->_M_dataplus)._M_p + 1));
    }
  }
  if (uVar21 != 0) {
    uVar19 = -uVar21;
    if (0 < (int)uVar21) {
      uVar19 = uVar21;
    }
    uVar18 = 1;
    if (9 < uVar19) {
      uVar15 = (ulong)uVar19;
      uVar17 = 4;
      do {
        uVar18 = uVar17;
        uVar10 = (uint)uVar15;
        if (uVar10 < 100) {
          uVar18 = uVar18 - 2;
          goto LAB_0014668e;
        }
        if (uVar10 < 1000) {
          uVar18 = uVar18 - 1;
          goto LAB_0014668e;
        }
        if (uVar10 < 10000) goto LAB_0014668e;
        uVar15 = uVar15 / 10000;
        uVar17 = uVar18 + 4;
      } while (99999 < uVar10);
      uVar18 = uVar18 + 1;
    }
LAB_0014668e:
    cVar2 = (char)((int)uVar21 >> 0x1f);
    pPVar12 = (pointer)(local_98 + 0x10);
    local_98._0_8_ = pPVar12;
    std::__cxx11::string::_M_construct((ulong)local_98,(char)uVar18 - cVar2);
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((long)&(((string *)local_98._0_8_)->_M_dataplus)._M_p +
                       (ulong)(uVar21 >> 0x1f)),uVar18,uVar19);
    puVar8 = (undefined8 *)std::__cxx11::string::replace((ulong)local_98,0,(char *)0x0,0x15aa90);
    pvVar14 = (pointer)(puVar8 + 2);
    if ((pointer)*puVar8 == pvVar14) {
      local_68._0_8_ =
           (pvVar14->super__Vector_base<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>)._M_impl.
           super__Vector_impl_data._M_start;
      local_68._8_8_ = puVar8[3];
      local_78._M_allocated_capacity = (size_type)(pointer)local_68;
    }
    else {
      local_68._0_8_ =
           (pvVar14->super__Vector_base<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>)._M_impl.
           super__Vector_impl_data._M_start;
      local_78._M_allocated_capacity = (size_type)(pointer)*puVar8;
    }
    local_78._8_8_ = puVar8[1];
    *puVar8 = pvVar14;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append(local_78._M_local_buf);
    psVar13 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_b8.field_2._M_allocated_capacity = *psVar13;
      local_b8.field_2._8_8_ = plVar7[3];
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    }
    else {
      local_b8.field_2._M_allocated_capacity = *psVar13;
      local_b8._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_b8._M_string_length = plVar7[1];
    *plVar7 = (long)psVar13;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_38,(ulong)local_b8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if ((pointer)local_78._M_allocated_capacity != (pointer)local_68) {
      operator_delete((void *)local_78._M_allocated_capacity,
                      (ulong)((long)&(((string *)local_68._0_8_)->_M_dataplus)._M_p + 1));
    }
    if ((pointer)local_98._0_8_ != pPVar12) {
      operator_delete((void *)local_98._0_8_,
                      (ulong)((long)&(((string *)local_98._16_8_)->_M_dataplus)._M_p + 1));
    }
    uVar18 = 1;
    if (9 < uVar19) {
      uVar15 = (ulong)uVar19;
      uVar17 = 4;
      do {
        uVar18 = uVar17;
        uVar10 = (uint)uVar15;
        if (uVar10 < 100) {
          uVar18 = uVar18 - 2;
          goto LAB_00146820;
        }
        if (uVar10 < 1000) {
          uVar18 = uVar18 - 1;
          goto LAB_00146820;
        }
        if (uVar10 < 10000) goto LAB_00146820;
        uVar15 = uVar15 / 10000;
        uVar17 = uVar18 + 4;
      } while (99999 < uVar10);
      uVar18 = uVar18 + 1;
    }
LAB_00146820:
    local_98._0_8_ = pPVar12;
    std::__cxx11::string::_M_construct((ulong)local_98,(char)uVar18 - cVar2);
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((long)&(((string *)local_98._0_8_)->_M_dataplus)._M_p +
                       (ulong)(uVar21 >> 0x1f)),uVar18,uVar19);
    puVar8 = (undefined8 *)std::__cxx11::string::replace((ulong)local_98,0,(char *)0x0,0x15aa90);
    pvVar14 = (pointer)(puVar8 + 2);
    if ((pointer)*puVar8 == pvVar14) {
      local_68._0_8_ =
           (pvVar14->super__Vector_base<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>)._M_impl.
           super__Vector_impl_data._M_start;
      local_68._8_8_ = puVar8[3];
      local_78._M_allocated_capacity = (size_type)(pointer)local_68;
    }
    else {
      local_68._0_8_ =
           (pvVar14->super__Vector_base<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>)._M_impl.
           super__Vector_impl_data._M_start;
      local_78._M_allocated_capacity = (size_type)(pointer)*puVar8;
    }
    local_78._8_8_ = puVar8[1];
    *puVar8 = pvVar14;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append(local_78._M_local_buf);
    plVar11 = plVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)plVar11) {
      local_b8.field_2._M_allocated_capacity = *plVar11;
      local_b8.field_2._8_8_ = plVar7[3];
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    }
    else {
      local_b8.field_2._M_allocated_capacity = *plVar11;
      local_b8._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_b8._M_string_length = plVar7[1];
    *plVar7 = (long)plVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_40,(ulong)local_b8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,(ulong)(local_b8.field_2._M_allocated_capacity + 1))
      ;
    }
    if ((pointer)local_78._M_allocated_capacity != (pointer)local_68) {
      operator_delete((void *)local_78._M_allocated_capacity,
                      (ulong)((long)&(((_Vector_impl *)&((string *)local_68._0_8_)->_M_dataplus)->
                                     super__Vector_impl_data)._M_start + 1));
    }
    if ((pointer)local_98._0_8_ != pPVar12) {
      operator_delete((void *)local_98._0_8_,
                      (ulong)((long)&(((string *)local_98._16_8_)->_M_dataplus)._M_p + 1));
    }
  }
  if (local_50.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return;
}

Assistant:

void ScreenInteractive::Draw(Component component) {
  auto document = component->Render();
  int dimx = 0;
  int dimy = 0;
  switch (dimension_) {
    case Dimension::Fixed:
      dimx = dimx_;
      dimy = dimy_;
      break;
    case Dimension::TerminalOutput:
      document->ComputeRequirement();
      dimx = Terminal::Size().dimx;
      dimy = document->requirement().min_y;
      break;
    case Dimension::Fullscreen:
      dimx = Terminal::Size().dimx;
      dimy = Terminal::Size().dimy;
      break;
    case Dimension::FitComponent:
      auto terminal = Terminal::Size();
      document->ComputeRequirement();
      dimx = std::min(document->requirement().min_x, terminal.dimx);
      dimy = std::min(document->requirement().min_y, terminal.dimy);
      break;
  }

  bool resized = (dimx != dimx_) || (dimy != dimy_);
  std::cout << reset_cursor_position << ResetPosition(/*clear=*/resized);

  // Resize the screen if needed.
  if (resized) {
    dimx_ = dimx;
    dimy_ = dimy;
    pixels_ = std::vector<std::vector<Pixel>>(dimy, std::vector<Pixel>(dimx));
    cursor_.x = dimx_ - 1;
    cursor_.y = dimy_ - 1;
  }

  // Periodically request the terminal emulator the frame position relative to
  // the screen. This is useful for converting mouse position reported in
  // screen's coordinates to frame's coordinates.
  static constexpr int cursor_refresh_rate =
#if defined(FTXUI_MICROSOFT_TERMINAL_FALLBACK)
      // Microsoft's terminal suffers from a [bug]. When reporting the cursor
      // position, several output sequences are mixed together into garbage.
      // This causes FTXUI user to see some "1;1;R" sequences into the Input
      // component. See [issue]. Solution is to request cursor position less
      // often. [bug]: https://github.com/microsoft/terminal/pull/7583 [issue]:
      // https://github.com/ArthurSonzogni/FTXUI/issues/136
      150;
#else
      20;
#endif
  static int i = -3;
  ++i;
  if (!use_alternative_screen_ && (i % cursor_refresh_rate == 0))
    std::cout << DeviceStatusReport(DSRMode::kCursor);

  Render(*this, document);

  // Set cursor position for user using tools to insert CJK characters.
  set_cursor_position = "";
  reset_cursor_position = "";

  int dx = dimx_ - 1 - cursor_.x;
  int dy = dimy_ - 1 - cursor_.y;

  if (dx != 0) {
    set_cursor_position += "\x1B[" + std::to_string(dx) + "D";
    reset_cursor_position += "\x1B[" + std::to_string(dx) + "C";
  }
  if (dy != 0) {
    set_cursor_position += "\x1B[" + std::to_string(dy) + "A";
    reset_cursor_position += "\x1B[" + std::to_string(dy) + "B";
  }
}